

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_VisMF.cpp
# Opt level: O3

void amrex::VisMF::AsyncWriteDoit
               (FabArray<amrex::FArrayBox> *mf,string *mf_name,bool is_rvalue,bool valid_cells_only)

{
  How HVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  NumComps ncomp;
  element_type *peVar5;
  BaseFab<double> *this;
  pointer pcVar6;
  Box bx;
  pointer plVar7;
  int iVar8;
  Arena *pAVar9;
  long lVar10;
  BaseFab<double> *pBVar11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  int *piVar12;
  FABio_binary *this_02;
  RealDescriptor *this_03;
  undefined4 extraout_var;
  _func_void *p_Var13;
  bool bVar14;
  undefined7 in_register_00000009;
  long lVar15;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var16;
  pointer ppFVar17;
  undefined7 in_register_00000011;
  void *__child_stack;
  FabArray<amrex::FArrayBox> *src;
  How *__args_1;
  char cVar18;
  ulong uVar19;
  _func_int **pp_Var20;
  _func_int *p_Var21;
  pointer this_04;
  pair<double,_double> pVar22;
  Vector<long,_std::allocator<long>_> localdata;
  shared_ptr<amrex::VisMF::Header> hdr;
  MFIter mfi;
  shared_ptr<amrex::FABio> fabio;
  stringstream hss;
  vector<long,_std::allocator<long>_> local_318;
  ulong local_2f8;
  ulong local_2f0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_2e8;
  undefined4 local_2e0;
  How local_2dc;
  int local_2d8;
  int local_2d4;
  int local_2d0;
  int local_2cc;
  Header *local_2c8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_2c0;
  _Any_data local_2b8;
  undefined4 local_2a8;
  undefined4 uStack_2a4;
  undefined4 uStack_2a0;
  undefined4 uStack_29c;
  int local_298;
  int local_290;
  long *local_280;
  long *local_278;
  ulong local_250;
  string *local_248;
  FABio *local_240;
  RealDescriptor *local_238;
  long local_230;
  long local_228;
  Box local_21c;
  BaseFab<double> local_200;
  undefined1 local_1b8 [16];
  undefined8 uStack_1a8;
  int local_1a0;
  undefined4 uStack_19c;
  int local_198 [2];
  element_type *local_190;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_188;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_180;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_178;
  Vector<amrex::Box,_std::allocator<amrex::Box>_> *local_170;
  Vector<int,_std::allocator<int>_> *local_168;
  Vector<amrex::Box,_std::allocator<amrex::Box>_> local_160;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_148;
  FABio_binary *local_140;
  Arena *apAStack_138 [33];
  
  local_2e0 = (undefined4)CONCAT71(in_register_00000011,is_rvalue);
  HVar1 = *(How *)(ParallelContext::frames + 0xc);
  local_2f8 = (ulong)*(uint *)(ParallelContext::frames + 0x10);
  local_238 = FPC::NativeRealDescriptor();
  __args_1 = (How *)local_1b8;
  local_1b8._0_4_ = NFiles;
  local_2b8._0_4_ = 1;
  local_21c.smallend.vect[0] = local_21c.smallend.vect[0] & 0xffffff00;
  local_2c8 = (Header *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<amrex::VisMF::Header,std::allocator<amrex::VisMF::Header>,amrex::FabArray<amrex::FArrayBox>const&,amrex::VisMF::How,amrex::VisMF::Header::Version,bool>
            (&local_2c0,&local_2c8,(allocator<amrex::VisMF::Header> *)&local_200,mf,__args_1,
             (Version *)local_2b8._M_pod_data,(bool *)&local_21c);
  if ((int)CONCAT71(in_register_00000009,valid_cells_only) != 0) {
    (local_2c8->m_ngrow).vect[0] = 0;
    (local_2c8->m_ngrow).vect[1] = 0;
    (local_2c8->m_ngrow).vect[2] = 0;
  }
  peVar5 = (mf->super_FabArrayBase).boxarray.m_ref.
           super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  uVar19 = (long)(peVar5->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                 super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           *(long *)&(peVar5->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                     super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                     super__Vector_impl_data;
  local_2f0 = (ulong)(mf->super_FabArrayBase).n_comp;
  std::vector<long,_std::allocator<long>_>::vector
            (&local_318,
             (long)(int)((ulong)((long)(mf->super_FabArrayBase).indexArray.
                                       super_vector<int,_std::allocator<int>_>.
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_finish -
                                (long)(mf->super_FabArrayBase).indexArray.
                                      super_vector<int,_std::allocator<int>_>.
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_start) >> 2) * (local_2f0 * 2 + 1)
             + 1,(allocator_type *)local_1b8);
  pAVar9 = DataAllocator::arena(&mf->m_dallocator);
  iVar8 = (*pAVar9->_vptr_Arena[7])(pAVar9);
  if ((char)iVar8 == '\0') {
    pAVar9 = DataAllocator::arena(&mf->m_dallocator);
    (*pAVar9->_vptr_Arena[8])(pAVar9);
  }
  plVar7 = local_318.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
           ._M_start;
  if (valid_cells_only) {
    bVar14 = (mf->super_FabArrayBase).n_grow.vect[2] != 0 ||
             *(long *)(mf->super_FabArrayBase).n_grow.vect != 0;
  }
  else {
    bVar14 = false;
  }
  local_2dc = HVar1;
  local_250 = uVar19;
  local_248 = mf_name;
  if ((long)local_318.super__Vector_base<long,_std::allocator<long>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_318.super__Vector_base<long,_std::allocator<long>_>._M_impl.
            super__Vector_impl_data._M_start < 9) {
    p_Var21 = (_func_int *)0x0;
  }
  else {
    local_240 = FArrayBox::getFABio();
    MFIter::MFIter((MFIter *)&local_2b8,&mf->super_FabArrayBase,'\0');
    if (local_298 < local_290) {
      pp_Var20 = (_func_int **)(plVar7 + 1);
      p_Var21 = (_func_int *)0x0;
      do {
        *pp_Var20 = p_Var21;
        lVar10 = (long)local_298;
        lVar15 = lVar10;
        if (local_278 != (long *)0x0) {
          lVar15 = (long)*(int *)(*local_278 + lVar10 * 4);
        }
        this = &(mf->m_fabs_v).
                super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>._M_impl.
                super__Vector_impl_data._M_start[lVar15]->super_BaseFab<double>;
        BATransformer::operator()
                  (&local_21c,(BATransformer *)(CONCAT44(local_2b8._12_4_,local_2b8._8_4_) + 8),
                   (Box *)((long)*(int *)(*local_280 + lVar10 * 4) * 0x1c +
                          **(long **)(CONCAT44(local_2b8._12_4_,local_2b8._8_4_) + 0x50)));
        std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
        uVar19 = local_2f0;
        iVar8 = (int)local_2f0;
        __args_1 = (How *)0x0;
        FArrayBox::FArrayBox((FArrayBox *)&local_200,&local_21c,iVar8,false,false,(Arena *)0x0);
        pBVar11 = this;
        if (bVar14) {
          pBVar11 = &local_200;
        }
        (*local_240->_vptr_FABio[6])(local_240,&uStack_1a8,pBVar11,uVar19 & 0xffffffff);
        lVar15 = std::ostream::tellp();
        pBVar11 = this;
        if (bVar14) {
          pBVar11 = &local_200;
        }
        local_228 = (long)pBVar11->nvar;
        iVar2 = (pBVar11->domain).bigend.vect[0];
        local_2d0 = (pBVar11->domain).smallend.vect[0];
        local_2cc = (pBVar11->domain).smallend.vect[1];
        local_2e8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    CONCAT44(local_2e8._4_4_,(pBVar11->domain).bigend.vect[1]);
        iVar3 = (pBVar11->domain).bigend.vect[2];
        iVar4 = (pBVar11->domain).smallend.vect[2];
        local_2d4 = RealDescriptor::numBytes(local_238);
        uVar19 = local_2f0;
        pp_Var20 = pp_Var20 + 1;
        local_2d8 = iVar3;
        local_230 = lVar15;
        if (0 < iVar8) {
          iVar8 = 0;
          do {
            pVar22 = BaseFab<double>::minmax<(amrex::RunOn)1>(this,&local_21c,iVar8);
            *pp_Var20 = (_func_int *)pVar22.first;
            pp_Var20[1] = (_func_int *)pVar22.second;
            iVar8 = iVar8 + 1;
            pp_Var20 = pp_Var20 + 2;
          } while ((int)uVar19 != iVar8);
        }
        p_Var21 = p_Var21 + (long)local_2d4 *
                            (long)((local_2d8 - iVar4) + 1) *
                            (long)(((int)local_2e8 - local_2cc) + 1) *
                            ((iVar2 - local_2d0) + 1) * local_228 + local_230;
        local_200._vptr_BaseFab = (_func_int **)&PTR__BaseFab_00712bd8;
        BaseFab<double>::clear(&local_200);
        std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
        std::ios_base::~ios_base((ios_base *)apAStack_138);
        MFIter::operator++((MFIter *)&local_2b8);
      } while (local_298 < local_290);
    }
    else {
      p_Var21 = (_func_int *)0x0;
    }
    MFIter::~MFIter((MFIter *)&local_2b8);
  }
  *local_318.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
   _M_start = (long)p_Var21;
  this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x28);
  this_00->_M_use_count = 1;
  this_00->_M_weak_count = 1;
  this_00->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00713900;
  this_00[1]._vptr__Sp_counted_base = (_func_int **)0x0;
  this_00[1]._M_use_count = 0;
  this_00[1]._M_weak_count = 0;
  this_00[2]._vptr__Sp_counted_base = (_func_int **)0x0;
  if ((int)local_2f8 == 1) {
    this_00[1]._vptr__Sp_counted_base =
         (_func_int **)
         local_318.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
         _M_start;
    *(pointer *)&this_00[1]._M_use_count =
         local_318.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
         _M_finish;
    this_00[2]._vptr__Sp_counted_base =
         (_func_int **)
         local_318.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage;
    local_318.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_318.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_318.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
  }
  p_Var16 = this_00;
  this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x28);
  iVar8 = (int)p_Var16;
  this_01->_M_use_count = 1;
  this_01->_M_weak_count = 1;
  this_01->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00713950;
  this_01[1]._vptr__Sp_counted_base = (_func_int **)0x0;
  this_01[1]._M_use_count = 0;
  this_01[1]._M_weak_count = 0;
  this_01[2]._vptr__Sp_counted_base = (_func_int **)0x0;
  src = mf;
  local_2e8 = this_00;
  MFIter::MFIter((MFIter *)local_1b8,&mf->super_FabArrayBase,'\0');
  this_04 = (pointer)(this_01 + 1);
  if (local_198[0] < (int)local_190) {
    cVar18 = (char)local_2e0;
    do {
      iVar8 = (((vector<int,_std::allocator<int>_> *)&local_180->_vptr__Sp_counted_base)->
              super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
              _M_start[local_198[0]];
      if (bVar14) {
        BATransformer::operator()
                  ((Box *)&local_2b8,(BATransformer *)(local_1b8._8_8_ + 8),
                   (Box *)((long)iVar8 * 0x1c +
                          *(long *)&(((((BoxArray *)(local_1b8._8_8_ + 8))->m_ref).
                                      super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>.
                                     _M_ptr)->m_abox).
                                    super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                    _M_impl.super__Vector_impl_data));
LAB_004441b0:
        local_21c.smallend.vect[0] = (mf->super_FabArrayBase).n_comp;
        local_200._vptr_BaseFab = (_func_int **)The_Cpu_Arena();
        std::vector<amrex::FArrayBox,std::allocator<amrex::FArrayBox>>::
        emplace_back<amrex::Box&,int,amrex::Arena*>
                  ((vector<amrex::FArrayBox,std::allocator<amrex::FArrayBox>> *)this_04,
                   (Box *)&local_2b8,(int *)&local_21c,(Arena **)&local_200);
        piVar12 = local_198;
        if (local_178 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          piVar12 = (((vector<int,_std::allocator<int>_> *)&local_178->_vptr__Sp_counted_base)->
                    super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
                    _M_start + local_198[0];
        }
        src = (FabArray<amrex::FArrayBox> *)
              (mf->m_fabs_v).
              super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>._M_impl.
              super__Vector_impl_data._M_start[*piVar12];
        ncomp.n = *(int *)(*(long *)&this_01[1]._M_use_count + -0x14);
        __args_1 = (How *)(ulong)(uint)ncomp.n;
        bx.btype.itype = uStack_2a0;
        bx.bigend.vect[2] = uStack_2a4;
        iVar8 = 0;
        bx.smallend.vect[2] = local_2b8._8_4_;
        bx.smallend.vect[0] = local_2b8._0_4_;
        bx.smallend.vect[1] = local_2b8._4_4_;
        bx.bigend.vect[0] = local_2b8._12_4_;
        bx.bigend.vect[1] = local_2a8;
        BaseFab<double>::copy<(amrex::RunOn)1>
                  ((BaseFab<double> *)(*(long *)&this_01[1]._M_use_count + -0x48),
                   (BaseFab<double> *)src,bx,(SrcComp)0x0,(DestComp)0x0,ncomp);
      }
      else {
        FabArrayBase::fabbox((Box *)&local_2b8,(FabArrayBase *)local_1b8._8_8_,iVar8);
        if (cVar18 != '\x01') goto LAB_004441b0;
        piVar12 = local_198;
        if (local_178 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          piVar12 = (((vector<int,_std::allocator<int>_> *)&local_178->_vptr__Sp_counted_base)->
                    super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
                    _M_start + local_198[0];
        }
        ppFVar17 = (mf->m_fabs_v).
                   super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        src = (FabArray<amrex::FArrayBox> *)ppFVar17[*piVar12];
        std::vector<amrex::FArrayBox,_std::allocator<amrex::FArrayBox>_>::
        emplace_back<amrex::FArrayBox>
                  ((vector<amrex::FArrayBox,_std::allocator<amrex::FArrayBox>_> *)this_04,
                   (FArrayBox *)src);
        iVar8 = (int)ppFVar17;
      }
      MFIter::operator++((MFIter *)local_1b8);
    } while (local_198[0] < (int)local_190);
  }
  MFIter::~MFIter((MFIter *)local_1b8);
  this_02 = (FABio_binary *)operator_new(0x10);
  p_Var16 = local_2e8;
  this_03 = FPC::NativeRealDescriptor();
  iVar8 = RealDescriptor::clone(this_03,(__fn *)src,__child_stack,iVar8,__args_1);
  FABio_binary::FABio_binary(this_02,(RealDescriptor *)CONCAT44(extraout_var,iVar8));
  local_200._vptr_BaseFab = (_func_int **)this_02;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<amrex::FABio_binary*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_200.super_DataAllocator,this_02);
  cVar18 = __libc_single_threaded;
  local_198[0] = (int)local_2f8;
  local_1b8._4_4_ = local_198[0] + -1;
  local_1a0 = (int)(local_250 >> 2) * -0x49249249;
  local_1b8._0_4_ = local_2dc;
  local_1b8._8_8_ = local_2c8;
  uStack_1a8 = local_2c0._M_pi;
  if (local_2c0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_2c0._M_pi)->_M_use_count = (local_2c0._M_pi)->_M_use_count + 1;
      UNLOCK();
      cVar18 = __libc_single_threaded;
    }
    else {
      (local_2c0._M_pi)->_M_use_count = (local_2c0._M_pi)->_M_use_count + 1;
    }
  }
  local_180 = p_Var16 + 1;
  uStack_19c = (undefined4)local_2f0;
  local_190 = (mf->super_FabArrayBase).distributionMap.m_ref.
              super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  local_188 = (mf->super_FabArrayBase).distributionMap.m_ref.
              super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
  if (local_188 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
LAB_004443c6:
    if (cVar18 == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
      goto LAB_004443e3;
    }
  }
  else {
    if (cVar18 == '\0') {
      LOCK();
      local_188->_M_use_count = local_188->_M_use_count + 1;
      UNLOCK();
      cVar18 = __libc_single_threaded;
      goto LAB_004443c6;
    }
    local_188->_M_use_count = local_188->_M_use_count + 1;
  }
  this_00->_M_use_count = this_00->_M_use_count + 1;
LAB_004443e3:
  pcVar6 = (local_248->_M_dataplus)._M_p;
  local_178 = this_00;
  local_170 = &local_160;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_170,pcVar6,pcVar6 + local_248->_M_string_length);
  if (__libc_single_threaded == '\0') {
    LOCK();
    this_01->_M_use_count = this_01->_M_use_count + 1;
    UNLOCK();
  }
  else {
    this_01->_M_use_count = this_01->_M_use_count + 1;
  }
  local_140 = (FABio_binary *)local_200._vptr_BaseFab;
  apAStack_138[0] = local_200.super_DataAllocator.m_arena;
  if (local_200.super_DataAllocator.m_arena != (Arena *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&((local_200.super_DataAllocator.m_arena)->arena_info).release_threshold =
           (int)((local_200.super_DataAllocator.m_arena)->arena_info).release_threshold + 1;
      UNLOCK();
    }
    else {
      *(int *)&((local_200.super_DataAllocator.m_arena)->arena_info).release_threshold =
           (int)((local_200.super_DataAllocator.m_arena)->arena_info).release_threshold + 1;
    }
  }
  local_2a8 = 0;
  uStack_2a4 = 0;
  uStack_2a0 = 0;
  uStack_29c = 0;
  local_2b8._M_unused._M_object = (void *)0x0;
  local_2b8._8_4_ = 0;
  local_2b8._12_4_ = 0;
  local_160.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = this_04;
  p_Stack_148 = this_01;
  p_Var13 = (_func_void *)operator_new(0x88);
  p_Var16 = local_178;
  *(ulong *)p_Var13 = CONCAT44(local_1b8._4_4_,local_1b8._0_4_);
  iVar8 = (int)uStack_1a8;
  iVar2 = uStack_1a8._4_4_;
  uStack_1a8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(undefined4 *)(p_Var13 + 8) = local_1b8._8_4_;
  *(undefined4 *)(p_Var13 + 0xc) = local_1b8._12_4_;
  *(int *)(p_Var13 + 0x10) = iVar8;
  *(int *)(p_Var13 + 0x14) = iVar2;
  local_1b8._8_8_ = (FabArrayBase *)0x0;
  *(int *)(p_Var13 + 0x20) = local_198[0];
  *(ulong *)(p_Var13 + 0x18) = CONCAT44(uStack_19c,local_1a0);
  *(element_type **)(p_Var13 + 0x28) = local_190;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(p_Var13 + 0x30) = local_188;
  if (local_188 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_188->_M_use_count = local_188->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_188->_M_use_count = local_188->_M_use_count + 1;
    }
  }
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(p_Var13 + 0x38) = local_180;
  local_178 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(p_Var13 + 0x40) = p_Var16;
  local_180 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(_func_void **)(p_Var13 + 0x48) = p_Var13 + 0x58;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(p_Var13 + 0x48),local_170,
             (long)&(local_168->super_vector<int,_std::allocator<int>_>).
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start + (long)local_170);
  pAVar9 = apAStack_138[0];
  p_Var16 = p_Stack_148;
  p_Stack_148 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(pointer *)(p_Var13 + 0x68) =
       local_160.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
       super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(p_Var13 + 0x70) = p_Var16;
  local_160.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  apAStack_138[0] = (Arena *)0x0;
  *(FABio_binary **)(p_Var13 + 0x78) = local_140;
  *(Arena **)(p_Var13 + 0x80) = pAVar9;
  local_140 = (FABio_binary *)0x0;
  uStack_2a0 = 0x444a1e;
  uStack_29c = 0;
  local_2a8 = 0x44525c;
  uStack_2a4 = 0;
  local_2b8._M_unused._0_8_ = (undefined8)p_Var13;
  AsyncOut::Submit((function<void_()> *)&local_2b8);
  if ((code *)CONCAT44(uStack_2a4,local_2a8) != (code *)0x0) {
    (*(code *)CONCAT44(uStack_2a4,local_2a8))(&local_2b8,&local_2b8,3);
  }
  if (apAStack_138[0] != (Arena *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)apAStack_138[0]);
  }
  if (p_Stack_148 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_148);
  }
  if (local_170 != &local_160) {
    operator_delete(local_170,
                    (ulong)((long)&(((vector<int,_std::allocator<int>_> *)
                                    &(local_160.
                                      super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                      _M_impl.super__Vector_impl_data._M_start)->smallend)->
                                   super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                   super__Vector_impl_data._M_start + 1));
  }
  if (local_178 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_178);
  }
  if (local_188 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_188);
  }
  if (uStack_1a8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(uStack_1a8);
  }
  if (local_200.super_DataAllocator.m_arena != (Arena *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_200.super_DataAllocator.m_arena
              );
  }
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  if ((_func_int **)
      local_318.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start != (_func_int **)0x0) {
    operator_delete(local_318.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_318.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_318.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_2c0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2c0._M_pi);
  }
  return;
}

Assistant:

void
VisMF::AsyncWriteDoit (const FabArray<FArrayBox>& mf, const std::string& mf_name,
                       bool is_rvalue, bool valid_cells_only)
{
    BL_PROFILE("VisMF::AsyncWrite()");

    AMREX_ASSERT(mf_name[mf_name.length() - 1] != '/');
    static_assert(sizeof(int64_t) == sizeof(Real)*2 || sizeof(int64_t) == sizeof(Real),
                  "AsyncWrite: unsupported Real size");

    const DistributionMapping& dm = mf.DistributionMap();

    const int myproc = ParallelDescriptor::MyProc();
    const int nprocs = ParallelDescriptor::NProcs();
    const int io_proc = nprocs - 1;

    RealDescriptor const& whichRD = FPC::NativeRealDescriptor();

    auto hdr = std::make_shared<VisMF::Header>(mf, VisMF::NFiles, VisMF::Header::Version_v1, false);
    if (valid_cells_only) hdr->m_ngrow = IntVect(0);

    constexpr int sizeof_int64_over_real = sizeof(int64_t) / sizeof(Real);
    const int n_local_fabs = mf.local_size();
    const int n_global_fabs = mf.size();
    const int ncomp = mf.nComp();
    const Long n_fab_reals = 2*ncomp;
    const Long n_fab_int64 = 1;
    const Long n_fab_nums = (n_fab_reals/sizeof_int64_over_real) + n_fab_int64;
    const Long n_local_nums = n_fab_nums * n_local_fabs + 1;
    Vector<int64_t> localdata(n_local_nums);

    bool data_on_device = mf.arena()->isManaged() || mf.arena()->isDevice();
    bool run_on_device = data_on_device && Gpu::inLaunchRegion();

    bool strip_ghost = valid_cells_only && mf.nGrowVect() != 0;

    int64_t total_bytes = 0;
    if (localdata.size() > 1) {
        char* pld = (char*)(&(localdata[1]));
        const FABio& fio = FArrayBox::getFABio();
        for (MFIter mfi(mf); mfi.isValid(); ++mfi)
        {
            std::memcpy(pld, &total_bytes, sizeof(int64_t));
            pld += sizeof(int64_t);

            const FArrayBox& fab = mf[mfi];
            const Box& bx = mfi.validbox();

            std::stringstream hss;
            FArrayBox valid_fab(bx, ncomp, false);
            FArrayBox const& header_fab = (strip_ghost) ? valid_fab : fab;
            fio.write_header(hss, header_fab, ncomp);
            total_bytes += static_cast<std::streamoff>(hss.tellp());
            total_bytes += header_fab.size() * whichRD.numBytes();

            // compute min and max
            for (int icomp = 0; icomp < ncomp; ++icomp) {
                auto mm = (run_on_device) ? fab.minmax<RunOn::Device>(bx,icomp)
                                          : fab.minmax<RunOn::Host  >(bx,icomp);
                std::memcpy(pld, &(mm.first), sizeof(Real));
                pld += sizeof(Real);
                std::memcpy(pld, &(mm.second), sizeof(Real));
                pld += sizeof(Real);
            }
        }
    }
    localdata[0] = total_bytes;

    auto globaldata = std::make_shared<Vector<int64_t> >();
    if (nprocs == 1) {
        *globaldata = std::move(localdata);
    }
#ifdef BL_USE_MPI
    else {
        const Long n_global_nums = n_fab_nums * n_global_fabs + nprocs;
        Vector<int> rcnt, rdsp;
        if (myproc == io_proc) {
            globaldata->resize(n_global_nums);
            rcnt.resize(nprocs,1);
            rdsp.resize(nprocs,0);
            for (int k = 0; k < n_global_fabs; ++k) {
                int rank = dm[k];
                rcnt[rank] += n_fab_nums;
            }
            std::partial_sum(rcnt.begin(), rcnt.end()-1, rdsp.begin()+1);
        } else {
            globaldata->resize(1,0);
            rcnt.resize(1,0);
            rdsp.resize(1,0);
        }
        BL_MPI_REQUIRE(MPI_Gatherv(localdata.data(), localdata.size(), MPI_INT64_T,
                                   globaldata->data(), rcnt.data(), rdsp.data(), MPI_INT64_T,
                                   io_proc, ParallelDescriptor::Communicator()));
    }
#endif

    auto myfabs = std::make_shared<Vector<FArrayBox> >();
    for (MFIter mfi(mf); mfi.isValid(); ++mfi) {
        Box bx = strip_ghost ? mfi.validbox() : mfi.fabbox();
#ifdef AMREX_USE_GPU
        if (data_on_device) {
            myfabs->emplace_back(bx, mf.nComp(), The_Pinned_Arena());
            auto& new_fab = myfabs->back();
            if (strip_ghost) {
                new_fab.copy<RunOn::Device>(mf[mfi], bx);
            } else {
                Gpu::dtoh_memcpy_async(new_fab.dataPtr(), mf[mfi].dataPtr(), new_fab.size()*sizeof(Real));
            }
        } else
#endif
        {
            if (is_rvalue && ! strip_ghost) {
                myfabs->emplace_back(std::move(const_cast<FArrayBox&>(mf[mfi])));
            } else {
                myfabs->emplace_back(bx, mf.nComp(), The_Cpu_Arena());
                auto& new_fab = myfabs->back();
                new_fab.copy<RunOn::Host>(mf[mfi], bx);
            }
        }
    }

    std::shared_ptr<FABio> fabio(new FABio_binary(FPC::NativeRealDescriptor().clone()));

    AsyncOut::Submit([=] ()
    {
        if (myproc == io_proc)
        {
            hdr->m_fod.resize(n_global_fabs);
            hdr->m_min.resize(n_global_fabs);
            hdr->m_max.resize(n_global_fabs);
            hdr->m_famin.clear();
            hdr->m_famax.clear();
            hdr->m_famin.resize(ncomp,std::numeric_limits<Real>::max());
            hdr->m_famax.resize(ncomp,std::numeric_limits<Real>::lowest());

            Vector<int64_t> nbytes_on_rank(nprocs,-1L);
            Vector<Vector<int> > gidx(nprocs);
            for (int k = 0; k < n_global_fabs; ++k) {
                int rank = dm[k];
                gidx[rank].push_back(k);
            }

            auto pgd = (char*)(globaldata->data());
            {
                int rank = 0, lidx = 0;
                for (int j = 0; j < n_global_fabs; ++j)
                {
                    int k = -1;
                    do {
                        if (lidx < gidx[rank].size()) {
                            k = gidx[rank][lidx];
                            ++lidx;
                        } else {
                            ++rank;
                            lidx = 0;
                        }
                    } while (k < 0);

                    hdr->m_min[k].resize(ncomp);
                    hdr->m_max[k].resize(ncomp);

                    if (nbytes_on_rank[rank] < 0) { // First time for this rank
                        std::memcpy(&(nbytes_on_rank[rank]), pgd, sizeof(int64_t));
                        pgd += sizeof(int64_t);
                    }

                    int64_t nbytes;
                    std::memcpy(&nbytes, pgd, sizeof(int64_t));
                    pgd += sizeof(int64_t);

                    for (int icomp = 0; icomp < ncomp; ++icomp) {
                        Real cmin, cmax;
                        std::memcpy(&cmin, pgd             , sizeof(Real));
                        std::memcpy(&cmax, pgd+sizeof(Real), sizeof(Real));
                        pgd += sizeof(Real)*2;
                        hdr->m_min[k][icomp] = cmin;
                        hdr->m_max[k][icomp] = cmax;
                        hdr->m_famin[icomp] = std::min(hdr->m_famin[icomp],cmin);
                        hdr->m_famax[icomp] = std::max(hdr->m_famax[icomp],cmax);
                    }

                    auto info = AsyncOut::GetWriteInfo(rank);
                    hdr->m_fod[k].m_name = amrex::Concatenate(VisMF::BaseName(mf_name)+FabFileSuffix,
                                                              info.ifile, 5);
                    hdr->m_fod[k].m_head = nbytes;
                }
            }

            Vector<int64_t> offset(nprocs);
            for (int ip = 0; ip < nprocs; ++ip) {
                auto info = AsyncOut::GetWriteInfo(ip);
                if (info.ispot == 0) {
                    offset[ip] = 0;
                } else {
                    offset[ip] = offset[ip-1] + nbytes_on_rank[ip-1];
                }
            }

            for (int k = 0; k < n_global_fabs; ++k) {
                hdr->m_fod[k].m_head += offset[dm[k]];
            }

            VisMF::WriteHeaderDoit(mf_name, *hdr);
        }

        VisMF::IO_Buffer io_buffer(ioBufferSize);

        AsyncOut::Wait();  // Wait for my turn

        auto info = AsyncOut::GetWriteInfo(myproc);
        if (! myfabs->empty()) {
            std::string file_name = amrex::Concatenate(mf_name + FabFileSuffix, info.ifile, 5);
            std::ofstream ofs;
            ofs.rdbuf()->pubsetbuf(io_buffer.dataPtr(), io_buffer.size());
            ofs.open(file_name.c_str(), (info.ispot == 0) ? (std::ios::binary | std::ios::trunc)
                                                          : (std::ios::binary | std::ios::app));
            if (!ofs.good()) amrex::FileOpenFailed(file_name);
            for (auto const& fab : *myfabs) {
                fabio->write_header(ofs, fab, fab.nComp());
                fabio->write(ofs, fab, 0, fab.nComp());
            }
            ofs.flush();
            ofs.close();
        }

        AsyncOut::Notify();  // Notify others I am done
    });
}